

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
length_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(length_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  json_type jVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_reference this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_01;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RSI
  ;
  undefined8 in_RDI;
  optional<unsigned_long> oVar5;
  value_type vVar6;
  type_conflict2 length;
  type sv0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  error_code *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff60;
  conv_flags flags;
  undefined1 *length_00;
  undefined7 in_stack_ffffffffffffff70;
  type local_60;
  undefined4 local_50;
  undefined1 local_40 [16];
  _Storage<unsigned_long,_true> local_30;
  undefined1 local_28;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  
  flags = (conv_flags)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_18 = in_RDX;
  sVar2 = std::
          vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RDX);
  oVar5 = function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::arity(in_RSI);
  local_30._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_28 = oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x570da9);
  if (sVar2 == *puVar3) {
    this_00 = std::
              vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::operator[](local_18,0);
    parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
              (this_00);
    length_00 = local_40;
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                      (in_stack_ffffffffffffff38);
    if (jVar1 == string_value) {
      local_60 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
                 as<std::basic_string_view<char,std::char_traits<char>>>
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            0x570ea2);
      this_02 = &local_60;
      std::basic_string_view<char,_std::char_traits<char>_>::data(this_02);
      std::basic_string_view<char,_std::char_traits<char>_>::size(this_02);
      unicode_traits::count_codepoints<char>
                ((char *)CONCAT17(jVar1,in_stack_ffffffffffffff70),(size_t)length_00,flags);
      jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      basic_json<unsigned_long>(unsigned_long,jsoncons::semantic_tag,std::enable_if<ext_traits::
      is_unsigned_integer<unsigned_long>::value&&((sizeof(unsigned_long))<=(8ul)),int>::type_
                (in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28,none,0x570f10);
    }
    else if ((byte)(jVar1 - array_value) < 2) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                (in_stack_ffffffffffffff38);
      jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      basic_json<unsigned_long>(unsigned_long,jsoncons::semantic_tag,std::enable_if<ext_traits::
      is_unsigned_integer<unsigned_long>::value&&((sizeof(unsigned_long))<=(8ul)),int>::type_
                (in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28,none,0x570e83);
    }
    else {
      std::error_code::operator=
                (in_stack_ffffffffffffff40,(jsonpath_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20)
                );
      this_01 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (this_01,in_stack_ffffffffffffff28);
    }
    local_50 = 1;
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x570f66);
    uVar4 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffff40,(jsonpath_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    uVar4 = extraout_RDX;
  }
  vVar6.field_0.int64_.val_ = uVar4;
  vVar6.field_0._0_8_ = in_RDI;
  return (value_type)vVar6.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0 = args[0].value();
            //std::cout << "length function arg: " << arg0 << "\n";

            switch (arg0.type())
            {
                case json_type::object_value:
                case json_type::array_value:
                    //std::cout << "LENGTH ARG: " << arg0 << "\n";
                    return value_type(arg0.size(), semantic_tag::none);
                case json_type::string_value:
                {
                    auto sv0 = arg0.template as<string_view_type>();
                    auto length = unicode_traits::count_codepoints(sv0.data(), sv0.size());
                    return value_type(length, semantic_tag::none);
                }
                default:
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
            }
        }